

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  int *piVar2;
  undefined8 *puVar3;
  uint uVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  undefined8 uVar7;
  long lVar8;
  seqStore_t *psVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  int iVar17;
  BYTE *litEnd;
  U32 UVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int *ip;
  int *piVar22;
  size_t sVar23;
  int *piVar24;
  seqDef *psVar25;
  size_t offset2;
  BYTE *litLimit_w;
  U32 local_e8;
  U32 local_e4;
  size_t local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  uint local_a4;
  BYTE *local_a0;
  int *local_98;
  int *local_90;
  BYTE *local_88;
  ZSTD_matchState_t *local_80;
  U32 *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  BYTE *local_58;
  seqStore_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pBVar15 = (BYTE *)((long)src + srcSize);
  piVar2 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  local_b8 = pBVar5 + uVar4;
  local_e8 = *rep;
  pZVar6 = ms->dictMatchState;
  local_b0 = (pZVar6->window).nextSrc;
  local_88 = (pZVar6->window).base;
  local_58 = local_88 + (pZVar6->window).dictLimit;
  iVar17 = (int)local_b0;
  local_e4 = rep[1];
  piVar22 = (int *)((ulong)(((int)src - ((int)local_58 + (int)local_b8)) + iVar17 == 0) + (long)src)
  ;
  if (piVar22 < piVar2) {
    local_a4 = ((int)local_88 - iVar17) + uVar4;
    local_a0 = local_88 + -(ulong)local_a4;
    local_98 = (int *)(pBVar15 + -0x20);
    iVar19 = (int)pBVar5;
    local_60 = (ulong)((1 - uVar4) - iVar19);
    local_68 = (ulong)(uint)-iVar19;
    local_70 = (ulong)((((iVar17 - uVar4) - (int)local_88) - iVar19) + 1);
    local_c0 = pBVar15;
    local_80 = ms;
    local_78 = rep;
    local_50 = seqStore;
    do {
      iVar17 = (int)piVar22;
      uVar10 = ((iVar17 - iVar19) - local_e8) + 1;
      piVar24 = (int *)(pBVar5 + uVar10);
      if (uVar10 < uVar4) {
        piVar24 = (int *)(local_88 + (uVar10 - local_a4));
      }
      if ((uVar10 - uVar4 < 0xfffffffd) && (*piVar24 == *(int *)((long)piVar22 + 1))) {
        pBVar14 = pBVar15;
        if (uVar10 < uVar4) {
          pBVar14 = local_b0;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar22 + 5),(BYTE *)(piVar24 + 1),pBVar15,pBVar14,
                            local_b8);
        uVar21 = sVar11 + 4;
      }
      else {
        uVar21 = 0;
      }
      local_c8 = 999999999;
      sVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                         (local_80,(BYTE *)piVar22,pBVar15,&local_c8);
      uVar12 = uVar21;
      if (uVar21 < sVar11) {
        uVar12 = sVar11;
      }
      if (uVar12 < 4) {
        piVar22 = (int *)((long)piVar22 + ((long)piVar22 - (long)src >> 8) + 1);
      }
      else {
        piVar24 = piVar22;
        sVar23 = local_c8;
        if (sVar11 <= uVar21) {
          piVar24 = (int *)((long)piVar22 + 1);
          sVar23 = 0;
        }
        uVar21 = uVar12;
        if (piVar22 < piVar2) {
          local_38 = (ulong)(((int)local_60 + iVar17) - local_e8);
          local_40 = (ulong)(((int)local_68 + iVar17) - local_e8);
          local_48 = (ulong)(((int)local_70 + iVar17) - local_e8);
          lVar20 = 0;
          local_90 = piVar22;
          do {
            ip = (int *)((long)local_90 + lVar20 + 1);
            iVar17 = (int)lVar20;
            uVar10 = (int)local_40 + iVar17 + 1;
            piVar22 = (int *)(pBVar5 + uVar10);
            if (uVar10 < uVar4) {
              piVar22 = (int *)(local_88 + (uint)((int)local_48 + iVar17));
            }
            uVar21 = uVar12;
            if (((uint)((int)local_38 + iVar17) < 0xfffffffd) && (*piVar22 == *ip)) {
              pBVar15 = local_c0;
              if (uVar10 < uVar4) {
                pBVar15 = local_b0;
              }
              sVar11 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_90 + lVar20 + 5),(BYTE *)(piVar22 + 1),
                                  local_c0,pBVar15,local_b8);
              if (sVar11 < 0xfffffffffffffffc) {
                uVar13 = (int)sVar23 + 1;
                uVar10 = 0x1f;
                if (uVar13 != 0) {
                  for (; uVar13 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar12 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                  sVar23 = 0;
                  piVar24 = ip;
                  uVar21 = sVar11 + 4;
                }
              }
            }
            local_c8 = 999999999;
            uVar12 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                               (local_80,(BYTE *)ip,local_c0,&local_c8);
            pBVar15 = local_c0;
            if (uVar12 < 4) goto LAB_001d1f6c;
            uVar13 = (int)sVar23 + 1;
            uVar10 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar13 = (int)local_c8 + 1;
            iVar17 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> iVar17 == 0; iVar17 = iVar17 + -1) {
              }
            }
            if ((int)uVar12 * 4 - iVar17 <= (int)((uVar10 ^ 0x1f) + (int)uVar21 * 4 + -0x1b))
            goto LAB_001d1f6c;
            lVar8 = lVar20 + 1;
            lVar20 = lVar20 + 1;
            piVar24 = ip;
            sVar23 = local_c8;
          } while ((int *)((long)local_90 + lVar8) < piVar2);
          piVar24 = (int *)((long)local_90 + lVar20);
          uVar21 = uVar12;
        }
LAB_001d1f6c:
        psVar9 = local_50;
        if (sVar23 == 0) {
          UVar18 = 1;
        }
        else {
          uVar12 = (long)piVar24 + (-(long)pBVar5 - sVar23) + -0xfffffffe;
          pBVar16 = pBVar5;
          pBVar14 = local_b8;
          if ((uint)uVar12 < uVar4) {
            pBVar16 = local_a0;
            pBVar14 = local_58;
          }
          if ((src < piVar24) && (uVar12 = uVar12 & 0xffffffff, pBVar14 < pBVar16 + uVar12)) {
            pBVar16 = pBVar16 + uVar12;
            do {
              pBVar16 = pBVar16 + -1;
              piVar22 = (int *)((long)piVar24 + -1);
              if ((*(BYTE *)piVar22 != *pBVar16) ||
                 (uVar21 = uVar21 + 1, piVar24 = piVar22, piVar22 <= src)) break;
            } while (pBVar14 < pBVar16);
          }
          local_e4 = local_e8;
          local_e8 = (int)sVar23 - 2;
          UVar18 = (int)sVar23 + 1;
        }
        uVar12 = (long)piVar24 - (long)src;
        pBVar14 = local_50->lit;
        if (local_98 < piVar24) {
          pBVar16 = pBVar14;
          piVar22 = (int *)src;
          if (src <= local_98) {
            pBVar16 = pBVar14 + ((long)local_98 - (long)src);
            uVar7 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar14 = *src;
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            piVar22 = local_98;
            if (0x10 < (long)local_98 - (long)src) {
              lVar20 = 0x10;
              do {
                uVar7 = ((undefined8 *)((long)src + lVar20))[1];
                pBVar1 = pBVar14 + lVar20;
                *(undefined8 *)pBVar1 = *(undefined8 *)((long)src + lVar20);
                *(undefined8 *)(pBVar1 + 8) = uVar7;
                puVar3 = (undefined8 *)((long)src + lVar20 + 0x10);
                uVar7 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                lVar20 = lVar20 + 0x20;
              } while (pBVar1 + 0x20 < pBVar16);
            }
          }
          if (piVar22 < piVar24) {
            lVar20 = 0;
            do {
              pBVar16[lVar20] = *(BYTE *)((long)piVar22 + lVar20);
              lVar20 = lVar20 + 1;
            } while ((long)piVar24 - (long)piVar22 != lVar20);
          }
LAB_001d20de:
          local_50->lit = local_50->lit + uVar12;
          psVar25 = local_50->sequences;
          if (0xffff < uVar12) {
            local_50->longLengthType = ZSTD_llt_literalLength;
            local_50->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)local_50->sequencesStart) >> 3);
          }
        }
        else {
          uVar7 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar14 = *src;
          *(undefined8 *)(pBVar14 + 8) = uVar7;
          pBVar14 = local_50->lit;
          if (0x10 < uVar12) {
            uVar7 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar14 + 0x18) = uVar7;
            if (0x20 < (long)uVar12) {
              lVar20 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar20 + 0x20);
                uVar7 = puVar3[1];
                pBVar16 = pBVar14 + lVar20 + 0x20;
                *(undefined8 *)pBVar16 = *puVar3;
                *(undefined8 *)(pBVar16 + 8) = uVar7;
                puVar3 = (undefined8 *)((long)src + lVar20 + 0x30);
                uVar7 = puVar3[1];
                *(undefined8 *)(pBVar16 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar16 + 0x18) = uVar7;
                lVar20 = lVar20 + 0x20;
              } while (pBVar16 + 0x20 < pBVar14 + uVar12);
            }
            goto LAB_001d20de;
          }
          local_50->lit = pBVar14 + uVar12;
          psVar25 = local_50->sequences;
        }
        psVar25->litLength = (U16)uVar12;
        psVar25->offset = UVar18;
        if (0xffff < uVar21 - 3) {
          local_50->longLengthType = ZSTD_llt_matchLength;
          local_50->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_50->sequencesStart) >> 3);
        }
        psVar25->matchLength = (U16)(uVar21 - 3);
        psVar25 = psVar25 + 1;
        local_50->sequences = psVar25;
        UVar18 = local_e8;
        for (piVar22 = (int *)((long)piVar24 + uVar21); local_e8 = UVar18, src = piVar22,
            piVar22 <= piVar2; piVar22 = (int *)((long)piVar22 + sVar11 + 4)) {
          uVar10 = ((int)piVar22 - iVar19) - local_e4;
          pBVar14 = pBVar5;
          if (uVar10 < uVar4) {
            pBVar14 = local_a0;
          }
          if ((0xfffffffc < uVar10 - uVar4) || (*(int *)(pBVar14 + uVar10) != *piVar22)) break;
          pBVar16 = pBVar15;
          if (uVar10 < uVar4) {
            pBVar16 = local_b0;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)(piVar22 + 1),(BYTE *)((long)(pBVar14 + uVar10) + 4),pBVar15,
                              pBVar16,local_b8);
          if (piVar22 <= local_98) {
            pBVar14 = psVar9->lit;
            uVar7 = *(undefined8 *)(piVar22 + 2);
            *(undefined8 *)pBVar14 = *(undefined8 *)piVar22;
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            psVar25 = psVar9->sequences;
          }
          psVar25->litLength = 0;
          psVar25->offset = 1;
          if (0xffff < sVar11 + 1) {
            psVar9->longLengthType = ZSTD_llt_matchLength;
            psVar9->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)psVar9->sequencesStart) >> 3);
          }
          psVar25->matchLength = (U16)(sVar11 + 1);
          psVar25 = psVar25 + 1;
          psVar9->sequences = psVar25;
          UVar18 = local_e4;
          local_e4 = local_e8;
        }
      }
      rep = local_78;
    } while (piVar22 < piVar2);
  }
  *rep = local_e8;
  rep[1] = local_e4;
  return (long)pBVar15 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dedicatedDictSearch);
}